

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::setTexCubeArrayBinding
          (ReferenceContext *this,int unitNdx,TextureCubeArray *texture)

{
  int *piVar1;
  pointer pTVar2;
  
  pTVar2 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2[unitNdx].texCubeArrayBinding != (TextureCubeArray *)0x0) {
    rc::ObjectManager<sglr::rc::Texture>::releaseReference
              (&this->m_textures,&(pTVar2[unitNdx].texCubeArrayBinding)->super_Texture);
    pTVar2 = (this->m_textureUnits).
             super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar2[unitNdx].texCubeArrayBinding = (TextureCubeArray *)0x0;
  }
  if (texture != (TextureCubeArray *)0x0) {
    piVar1 = &(texture->super_Texture).super_NamedObject.m_refCount;
    *piVar1 = *piVar1 + 1;
    pTVar2[unitNdx].texCubeArrayBinding = texture;
  }
  return;
}

Assistant:

void ReferenceContext::setTexCubeArrayBinding (int unitNdx, TextureCubeArray* texture)
{
	if (m_textureUnits[unitNdx].texCubeArrayBinding)
	{
		m_textures.releaseReference(m_textureUnits[unitNdx].texCubeArrayBinding);
		m_textureUnits[unitNdx].texCubeArrayBinding = DE_NULL;
	}

	if (texture)
	{
		m_textures.acquireReference(texture);
		m_textureUnits[unitNdx].texCubeArrayBinding = texture;
	}
}